

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_digest.cpp
# Opt level: O1

void __thiscall argparse::args_t::args_t(args_t *this,int argc,char **argv)

{
  byte *__s1;
  byte bVar1;
  char *str;
  int iVar2;
  FILE *pFVar3;
  int iVar4;
  char *__s1_00;
  byte *__s1_01;
  
  this->input = _stdin;
  this->output = (FILE *)_stdout;
  this->motif_list = (char *)0x0;
  this->rc = complement;
  this->match = exact;
  if (1 < argc) {
    iVar4 = 1;
    do {
      str = argv[iVar4];
      if (*str == '-') {
        if (str[1] == '-') {
          __s1_01 = (byte *)(str + 2);
          __s1_00 = "help";
          iVar2 = strcmp((char *)__s1_01,"help");
          if (iVar2 == 0) {
            argparse::args_t();
            goto LAB_00106633;
          }
          goto LAB_00106579;
        }
        __s1 = (byte *)(str + 1);
        __s1_00 = "h";
        __s1_01 = __s1;
        iVar2 = strcmp((char *)__s1,"h");
        if (iVar2 == 0) {
LAB_00106633:
          argparse::args_t();
          pFVar3 = _stdout;
          if ((__s1_00 != (char *)0x0) &&
             (iVar4 = strcmp(__s1_00,"-"), pFVar3 = _stdout, iVar4 != 0)) {
            pFVar3 = fopen(__s1_00,"wb");
          }
          *(FILE **)(__s1_01 + 8) = pFVar3;
          if (pFVar3 != (FILE *)0x0) {
            return;
          }
          ERROR("failed to open the OUTPUT file %s",__s1_00);
          return;
        }
        bVar1 = *__s1;
        if (bVar1 < 0x6f) {
          if (bVar1 == 0x65) {
            iVar4 = iVar4 + 1;
            if (iVar4 == argc) {
              ERROR("ran out of command line arguments");
            }
            parse_motif(this,argv[iVar4]);
          }
          else if (bVar1 == 0x6d) {
            iVar4 = iVar4 + 1;
            if (iVar4 == argc) {
              ERROR("ran out of command line arguments");
            }
            parse_match_mode(this,argv[iVar4]);
          }
          else {
LAB_00106597:
            ERROR("unknown argument: %s",str);
          }
        }
        else if (bVar1 == 0x72) {
          iVar4 = iVar4 + 1;
          if (iVar4 == argc) {
            ERROR("ran out of command line arguments");
          }
          parse_rc_option(this,argv[iVar4]);
        }
        else {
          if (bVar1 != 0x6f) goto LAB_00106597;
          iVar4 = iVar4 + 1;
          if (iVar4 == argc) {
            ERROR("ran out of command line arguments");
          }
          parse_output(this,argv[iVar4]);
        }
      }
      else {
        if (iVar4 == argc + -1) {
          parse_input(this,str);
          goto LAB_0010658a;
        }
LAB_00106579:
        ERROR("unknown argument: %s",str);
      }
LAB_0010658a:
      iVar4 = iVar4 + 1;
    } while (iVar4 < argc);
  }
  if (this->motif_list != (char *)0x0) {
    return;
  }
  ERROR("Required argument MOTIF_LIST was not provided");
  return;
}

Assistant:

args_t::args_t( int argc, const char * argv[] ) :
    input( stdin ),
    output( stdout ),
    rc ( DEFAULT_RC ),
    match (DEFAULT_MATCH),
    motif_list (NULL)
    {
        // skip arg[0], it's just the program name
        for (int i = 1; i < argc; ++i ) {
            const char * arg = argv[i];
            
            if ( arg[0] == '-' && arg[1] == '-' ) {
                if ( !strcmp( &arg[2], "help" ) ) help();
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else if ( arg[0] == '-' ) {
                if ( !strcmp( &arg[1], "h" ) ) help();
                else if (  arg[1] == 'o' ) parse_output( next_arg (i, argc, argv) );
                else if (  arg[1] == 'r')  parse_rc_option ( next_arg (i, argc, argv) );
                else if (  arg[1] == 'm')  parse_match_mode( next_arg (i, argc, argv) );
                else if (  arg[1] == 'e')  parse_motif( next_arg (i, argc, argv) );
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else
                if (i == argc-1) {
                    parse_input (arg);
                } else {
                    ERROR( "unknown argument: %s", arg );
                }
        }
                
        if (motif_list == NULL) {
            ERROR ("Required argument MOTIF_LIST was not provided");
        }
    }